

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDepsHelper
          (DescriptorBuilder *this,DescriptorPool *pool,string *name,bool build_it)

{
  Tables *pTVar1;
  bool bVar2;
  const_iterator cVar3;
  Type TVar5;
  Symbol SVar6;
  MutexLockMaybe lock;
  MutexLockMaybe local_40;
  pointer local_38;
  anon_union_8_8_13f84498_for_Symbol_2 aVar4;
  
  if (this->pool_ == pool) {
    local_40.mu_ = (Mutex *)0x0;
  }
  else {
    local_40.mu_ = pool->mutex_;
  }
  if (local_40.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_40.mu_);
  }
  pTVar1 = (pool->tables_).ptr_;
  if (pTVar1 != (Tables *)0x0) {
    local_38 = (name->_M_dataplus)._M_p;
    cVar3 = std::
            _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&pTVar1->symbols_by_name_,&local_38);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
        _M_cur == (__node_type *)0x0) {
      TVar5 = NULL_SYMBOL;
      aVar4.descriptor = (Descriptor *)0x0;
    }
    else {
      TVar5 = *(Type *)((long)cVar3.
                              super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                              ._M_cur + 0x10);
      aVar4 = (anon_union_8_8_13f84498_for_Symbol_2)
              ((anon_union_8_8_13f84498_for_Symbol_2 *)
              ((long)cVar3.
                     super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                     ._M_cur + 0x18))->descriptor;
    }
    if ((TVar5 == NULL_SYMBOL) && (pool->underlay_ != (DescriptorPool *)0x0)) {
      SVar6 = FindSymbolNotEnforcingDepsHelper(this,pool->underlay_,name,true);
      aVar4 = SVar6.field_1;
      TVar5 = SVar6.type;
    }
    if (build_it && TVar5 == NULL_SYMBOL) {
      bVar2 = DescriptorPool::TryFindSymbolInFallbackDatabase(pool,name);
      if (bVar2) {
        pTVar1 = (pool->tables_).ptr_;
        if (pTVar1 == (Tables *)0x0) goto LAB_0058825f;
        local_38 = (name->_M_dataplus)._M_p;
        cVar3 = std::
                _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)&pTVar1->symbols_by_name_,&local_38);
        if (cVar3.
            super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
            _M_cur == (__node_type *)0x0) {
          aVar4.descriptor = (Descriptor *)0x0;
          TVar5 = NULL_SYMBOL;
        }
        else {
          TVar5 = *(Type *)((long)cVar3.
                                  super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                                  ._M_cur + 0x10);
          aVar4 = (anon_union_8_8_13f84498_for_Symbol_2)
                  ((anon_union_8_8_13f84498_for_Symbol_2 *)
                  ((long)cVar3.
                         super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                         ._M_cur + 0x18))->descriptor;
        }
      }
    }
    internal::MutexLockMaybe::~MutexLockMaybe(&local_40);
    SVar6._4_4_ = 0;
    SVar6.type = TVar5;
    SVar6.field_1.descriptor = aVar4.descriptor;
    return SVar6;
  }
LAB_0058825f:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDepsHelper(
    const DescriptorPool* pool, const string& name, bool build_it) {
  // If we are looking at an underlay, we must lock its mutex_, since we are
  // accessing the underlay's tables_ directly.
  MutexLockMaybe lock((pool == pool_) ? NULL : pool->mutex_);

  Symbol result = pool->tables_->FindSymbol(name);
  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result = FindSymbolNotEnforcingDepsHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // With lazily_build_dependencies_, a symbol lookup at cross link time is
    // not guaranteed to be successful. In most cases, build_it will be false,
    // which intentionally prevents us from building an import until it's
    // actually needed. In some cases, like registering an extension, we want
    // to build the file containing the symbol, and build_it will be set.
    // Also, build_it will be true when !lazily_build_dependencies_, to provide
    // better error reporting of missing dependencies.
    if (build_it && pool->TryFindSymbolInFallbackDatabase(name)) {
      result = pool->tables_->FindSymbol(name);
    }
  }

  return result;
}